

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O0

void process_world(chunk_conflict *c)

{
  ushort uVar1;
  bool bVar2;
  player *ppVar3;
  _Bool _Var4;
  wchar_t wVar5;
  wchar_t wVar6;
  uint32_t uVar7;
  int iVar8;
  loc_conflict lVar9;
  square_conflict *psVar10;
  source sVar11;
  source origin;
  source origin_00;
  wchar_t local_9c;
  wchar_t target_depth;
  wchar_t target_increment;
  _Bool changed;
  trap *trap;
  loc grid;
  int32_t d;
  wchar_t drain;
  _Bool local_1e;
  byte local_1d;
  wchar_t local_1c;
  _Bool ident;
  wchar_t wStack_18;
  _Bool dawn;
  wchar_t x;
  wchar_t y;
  wchar_t i;
  chunk_conflict *c_local;
  
  _y = (chunk_conflict2 *)c;
  wVar5 = cave_monster_count(c);
  if ((int)(uint)z_info->level_monster_max < wVar5 + L' ') {
    compact_monsters((chunk *)_y,L'@');
  }
  wVar5 = cave_monster_count((chunk_conflict *)_y);
  wVar6 = cave_monster_max((chunk_conflict *)_y);
  if (wVar5 + L' ' < wVar6) {
    compact_monsters((chunk *)_y,L'\0');
  }
  if ((long)turn % (long)(((ulong)z_info->day_length * 10) / 4) == 0) {
    play_ambient_sound();
  }
  if (player->depth == 0) {
    if ((long)turn % (long)(((ulong)z_info->day_length * 10) / 2) == 0) {
      local_1d = ((long)turn % (long)((ulong)z_info->day_length * 10) != 0 ^ 0xffU) & 1;
      if (local_1d == 0) {
        msg("The sun has fallen.");
      }
      else {
        msg("The sun has risen.");
      }
      cave_illuminate((chunk *)_y,(_Bool)(local_1d & 1));
    }
  }
  else if ((long)turn % (long)((ulong)z_info->store_turns * 10) == 0) {
    daycount = daycount + 1;
  }
  _Var4 = flag_has_dbg((player->state).pflags,3,0xc,"player->state.pflags","(PF_UNLIGHT)");
  if (_Var4) {
    player->upkeep->update = player->upkeep->update | 1;
  }
  uVar7 = Rand_div((uint)z_info->alloc_monster_chance);
  if (uVar7 == 0) {
    lVar9.x = (player->grid).x;
    lVar9.y = (player->grid).y;
    pick_and_place_distant_monster
              ((chunk *)_y,lVar9,(uint)z_info->max_sight + L'\x05',true,(int)player->depth);
  }
  ppVar3 = player;
  if (player->timed[7] != 0) {
    wVar5 = player_apply_damage_reduction(player,L'\x01');
    take_hit(ppVar3,wVar5,"poison");
    if ((player->is_dead & 1U) != 0) {
      return;
    }
  }
  if (player->timed[8] != 0) {
    _Var4 = flag_has_dbg((player->state).pflags,3,0xd,"player->state.pflags","(PF_ROCK)");
    if (_Var4) {
      x = L'\0';
    }
    else {
      _Var4 = player_timed_grade_eq(player,L'\b',"Mortal Wound");
      if ((_Var4) || (_Var4 = player_timed_grade_eq(player,L'\b',"Deep Gash"), _Var4)) {
        x = L'\x03';
      }
      else {
        _Var4 = player_timed_grade_eq(player,L'\b',"Severe Cut");
        if (_Var4) {
          x = L'\x02';
        }
        else {
          x = L'\x01';
        }
      }
    }
    ppVar3 = player;
    wVar5 = player_apply_damage_reduction(player,x);
    take_hit(ppVar3,wVar5,"a fatal wound");
    if ((player->is_dead & 1U) != 0) {
      return;
    }
  }
  if (player->timed[0x31] != 0) {
    if (10 - player->timed[0x31] < 1) {
      local_9c = L'\0';
    }
    else {
      local_9c = L'\n' - player->timed[0x31];
    }
    player_over_exert(player,L'È',local_9c,(int)player->chp / 10);
    if ((player->is_dead & 1U) != 0) {
      return;
    }
  }
  if (player->timed[0x2b] != 0) {
    local_1e = false;
    sVar11 = source_player();
    origin.which = sVar11.which;
    origin._4_4_ = 0;
    origin.what = sVar11.what;
    effect_simple(L'\x03',origin,"30",L'\0',L'\0',L'\0',L'\0',L'\0',&local_1e);
  }
  if (player->timed[0x32] != 0) {
    uVar7 = Rand_div(2);
    if (uVar7 == 0) {
      msg("The Black Breath sickens you.");
      player_stat_dec(player,L'\x04',false);
    }
    uVar7 = Rand_div(2);
    if (uVar7 == 0) {
      msg("The Black Breath saps your strength.");
      player_stat_dec(player,L'\0',false);
    }
    uVar7 = Rand_div(2);
    if (uVar7 == 0) {
      iVar8 = player->exp;
      uVar1 = z_info->life_drain_percent;
      msg("The Black Breath dims your life force.");
      player_exp_lose(player,(iVar8 / 100) * (uint)uVar1 + 100,false);
    }
  }
  _Var4 = player_timed_grade_eq(player,L'\n',"Full");
  if (_Var4) {
    player_dec_timed(player,L'\n',(wchar_t)(5000 / (ulong)(long)(int)(uint)z_info->food_value),false
                     ,true);
    player->upkeep->update = player->upkeep->update | 1;
  }
  else {
    if (turn % 100 == 0) {
      wVar5 = turn_energy((player->state).speed);
      x = (wVar5 * 100) / (int)(uint)z_info->food_value;
      _Var4 = player_of_has(player,L'\f');
      if (_Var4) {
        x = x << 1;
      }
      _Var4 = player_of_has(player,L'\n');
      if (_Var4) {
        x = x / 2;
      }
      if (x < L'\x01') {
        x = L'\x01';
      }
      player_dec_timed(player,L'\n',x,false,true);
    }
    if ((player->timed[0x2b] != 0) &&
       (player_dec_timed(player,L'\n',(uint)z_info->food_value << 3,false,true),
       player->timed[10] < PY_FOOD_HUNGRY)) {
      player_set_timed(player,L'+',L'\0',true,true);
    }
  }
  _Var4 = player_timed_grade_eq(player,L'\n',"Faint");
  if (_Var4) {
    if ((player->timed[3] == 0) && (uVar7 = Rand_div(10), uVar7 == 0)) {
      msg("You faint from the lack of food.");
      disturb(player);
      ppVar3 = player;
      uVar7 = Rand_div(5);
      player_inc_timed(ppVar3,L'\x03',uVar7 + L'\x01',true,true,false);
    }
  }
  else {
    _Var4 = player_timed_grade_eq(player,L'\n',"Starving");
    ppVar3 = player;
    if (_Var4) {
      x = (PY_FOOD_STARVE - player->timed[10]) / 10;
      wVar5 = player_apply_damage_reduction(player,x);
      take_hit(ppVar3,wVar5,"starvation");
      if ((player->is_dead & 1U) != 0) {
        return;
      }
    }
  }
  if (player->chp < player->mhp) {
    player_regen_hp(player);
  }
  player_regen_mana(player);
  decrease_timeouts();
  player_update_light(player);
  _Var4 = player_is_resting(player);
  if (!_Var4) {
    make_noise(player);
    update_scent();
  }
  _Var4 = player_of_has(player,L'\x1b');
  if (_Var4) {
    if ((0 < player->exp) && (uVar7 = Rand_div(10), uVar7 == 0)) {
      iVar8 = damroll(10,6);
      player_exp_lose(player,(int)(iVar8 + (player->exp / 100) * (uint)z_info->life_drain_percent) /
                             10,false);
    }
    equip_learn_flag(player,L'\x1b');
  }
  recharge_objects();
  if (turn % 100 == 0) {
    equip_learn_after_time(player);
  }
  for (wStack_18 = L'\0'; wStack_18 < _y->height; wStack_18 = wStack_18 + L'\x01') {
    for (local_1c = L'\0'; local_1c < _y->width; local_1c = local_1c + L'\x01') {
      lVar9 = (loc_conflict)loc(local_1c,wStack_18);
      psVar10 = square((chunk *)_y,lVar9);
      bVar2 = false;
      for (_target_increment = psVar10->trap; _target_increment != (trap *)0x0;
          _target_increment = _target_increment->next) {
        if ((_target_increment->timeout != '\0') &&
           (_target_increment->timeout = _target_increment->timeout + 0xff,
           _target_increment->timeout == '\0')) {
          bVar2 = true;
        }
      }
      if ((bVar2) && (_Var4 = square_isseen((chunk *)_y,lVar9), _Var4)) {
        square_memorize_traps(_y,lVar9);
        square_light_spot((chunk *)_y,(loc)lVar9);
      }
    }
  }
  if (((player->word_recall != 0) && ((player->upkeep->arena_level & 1U) == 0)) &&
     (player->word_recall = player->word_recall + -1, player->word_recall == 0)) {
    disturb(player);
    cmdq_flush();
    if (player->depth == 0) {
      msgt(0x19,"You feel yourself yanked downwards!");
      player_set_recall_depth(player);
      dungeon_change_level(player,(int)player->recall_depth);
    }
    else {
      msgt(0x19,"You feel yourself yanked upwards!");
      dungeon_change_level(player,L'\0');
    }
  }
  if ((player->deep_descent != 0) &&
     (player->deep_descent = player->deep_descent + -1, player->deep_descent == 0)) {
    wVar5 = dungeon_get_next_level
                      (player,(int)player->max_depth,
                       (int)(4 / (ulong)(long)(int)(uint)z_info->stair_skip) + L'\x01');
    disturb(player);
    if (player->depth < wVar5) {
      msgt(0x19,"The floor opens beneath you!");
      dungeon_change_level(player,wVar5);
    }
    else {
      msgt(0x19,"You are thrown back in an explosion!");
      sVar11 = source_none();
      origin_00.which = sVar11.which;
      origin_00._4_4_ = 0;
      origin_00.what = sVar11.what;
      effect_simple(L'?',origin_00,"0",L'\0',L'\x05',L'\0',L'\0',L'\0',(_Bool *)0x0);
    }
  }
  return;
}

Assistant:

void process_world(struct chunk *c)
{
	int i, y, x;

	/* Compact the monster list if we're approaching the limit */
	if (cave_monster_count(c) + 32 > z_info->level_monster_max)
		compact_monsters(c, 64);

	/* Too many holes in the monster list - compress */
	if (cave_monster_count(c) + 32 < cave_monster_max(c))
		compact_monsters(c, 0);

	/*** Check the Time ***/

	/* Play an ambient sound at regular intervals. */
	if (!(turn % ((10L * z_info->day_length) / 4)))
		play_ambient_sound();

	/* Handle stores and sunshine */
	if (!player->depth) {
		/* Daybreak/Nighfall in town */
		if (!(turn % ((10L * z_info->day_length) / 2))) {
			/* Check for dawn */
			bool dawn = (!(turn % (10L * z_info->day_length)));

			if (dawn) {
				/* Day breaks */
				msg("The sun has risen.");
			} else {
				/* Night falls */
				msg("The sun has fallen.");
			}

			/* Illuminate */
			cave_illuminate(c, dawn);
		}
	} else {
		/* Update the stores once a day (while in the dungeon).
		   The changes are not actually made until return to town,
		   to avoid giving details away in the knowledge menu. */
		if (!(turn % (10L * z_info->store_turns))) daycount++;
	}

	/* Check for light change */
	if (player_has(player, PF_UNLIGHT)) {
		player->upkeep->update |= PU_BONUS;
	}

	/* Check for creature generation */
	if (one_in_(z_info->alloc_monster_chance)) {
		(void)pick_and_place_distant_monster(c, player->grid,
			z_info->max_sight + 5, true, player->depth);
	}

	/*** Damage (or healing) over Time ***/

	/* Take damage from poison */
	if (player->timed[TMD_POISONED]) {
		take_hit(player, player_apply_damage_reduction(player, 1),
			"poison");
		if (player->is_dead) {
			return;
		}
	}

	/* Take damage from cuts, worse from serious cuts */
	if (player->timed[TMD_CUT]) {
		if (player_has(player, PF_ROCK)) {
			/* Rock players just maintain */
			i = 0;
		} else if (player_timed_grade_eq(player, TMD_CUT, "Mortal Wound") ||
				   player_timed_grade_eq(player, TMD_CUT, "Deep Gash")) {
			i = 3;
		} else if (player_timed_grade_eq(player, TMD_CUT, "Severe Cut")) {
			i = 2;
		} else {
			i = 1;
		}

		/* Take damage */
		take_hit(player, player_apply_damage_reduction(player, i),
			"a fatal wound");
		if (player->is_dead) {
			return;
		}
	}

	/* Side effects of diminishing bloodlust */
	if (player->timed[TMD_BLOODLUST]) {
		player_over_exert(player, PY_EXERT_HP | PY_EXERT_CUT | PY_EXERT_SLOW,
						  MAX(0, 10 - player->timed[TMD_BLOODLUST]),
						  player->chp / 10);
		if (player->is_dead) {
			return;
		}
	}

	/* Timed healing */
	if (player->timed[TMD_HEAL]) {
		bool ident = false;
		effect_simple(EF_HEAL_HP, source_player(), "30", 0, 0, 0, 0, 0, &ident);
	}

	/* Effects of Black Breath */
	if (player->timed[TMD_BLACKBREATH]) {
		if (one_in_(2)) {
			msg("The Black Breath sickens you.");
			player_stat_dec(player, STAT_CON, false);
		}
		if (one_in_(2)) {
			msg("The Black Breath saps your strength.");
			player_stat_dec(player, STAT_STR, false);
		}
		if (one_in_(2)) {
			/* Life draining */
			int drain = 100 + (player->exp / 100) * z_info->life_drain_percent;
			msg("The Black Breath dims your life force.");
			player_exp_lose(player, drain, false);
		}
	}

	/*** Check the Food, and Regenerate ***/

	/* Digest */
	if (!player_timed_grade_eq(player, TMD_FOOD, "Full")) {
		/* Digest normally */
		if (!(turn % 100)) {
			/* Basic digestion rate based on speed */
			i = turn_energy(player->state.speed);

			/* Adjust for food value */
			i = (i * 100) / z_info->food_value;

			/* Regeneration takes more food */
			if (player_of_has(player, OF_REGEN)) i *= 2;

			/* Slow digestion takes less food */
			if (player_of_has(player, OF_SLOW_DIGEST)) i /= 2;

			/* Minimal digestion */
			if (i < 1) i = 1;

			/* Digest some food */
			player_dec_timed(player, TMD_FOOD, i, false, true);
		}

		/* Fast metabolism */
		if (player->timed[TMD_HEAL]) {
			player_dec_timed(player, TMD_FOOD,
				8 * z_info->food_value, false, true);
			if (player->timed[TMD_FOOD] < PY_FOOD_HUNGRY) {
				player_set_timed(player, TMD_HEAL, 0, true,
					true);
			}
		}
	} else {
		/* Digest quickly when gorged */
		player_dec_timed(player, TMD_FOOD, 5000 / z_info->food_value,
			false, true);
		player->upkeep->update |= PU_BONUS;
	}

	/* Faint or starving */
	if (player_timed_grade_eq(player, TMD_FOOD, "Faint")) {
		/* Faint occasionally */
		if (!player->timed[TMD_PARALYZED] && one_in_(10)) {
			/* Message */
			msg("You faint from the lack of food.");
			disturb(player);

			/* Faint (bypass free action) */
			(void)player_inc_timed(player, TMD_PARALYZED,
				1 + randint0(5), true, true, false);
		}
	} else if (player_timed_grade_eq(player, TMD_FOOD, "Starving")) {
		/* Calculate damage */
		i = (PY_FOOD_STARVE - player->timed[TMD_FOOD]) / 10;

		/* Take damage */
		take_hit(player, player_apply_damage_reduction(player, i),
			"starvation");
		if (player->is_dead) {
			return;
		}
	}

	/* Regenerate Hit Points if needed */
	if (player->chp < player->mhp)
		player_regen_hp(player);

	/* Regenerate or lose mana */
	player_regen_mana(player);

	/* Timeout various things */
	decrease_timeouts();

	/* Process light */
	player_update_light(player);

	/* Update noise and scent (not if resting) */
	if (!player_is_resting(player)) {
		make_noise(player);
		update_scent();
	}


	/*** Process Inventory ***/

	/* Handle experience draining */
	if (player_of_has(player, OF_DRAIN_EXP)) {
		if ((player->exp > 0) && one_in_(10)) {
			int32_t d = damroll(10, 6) +
				(player->exp / 100) * z_info->life_drain_percent;
			player_exp_lose(player, d / 10, false);
		}

		equip_learn_flag(player, OF_DRAIN_EXP);
	}

	/* Recharge activatable objects and rods */
	recharge_objects();

	/* Notice things after time */
	if (!(turn % 100))
		equip_learn_after_time(player);

	/* Decrease trap timeouts */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);
			struct trap *trap = square(c, grid)->trap;
			bool changed = false;
			while (trap) {
				if (trap->timeout) {
					trap->timeout--;
					if (!trap->timeout) {
						changed = true;
					}
				}
				trap = trap->next;
			}
			if (changed && square_isseen(c, grid)) {
				square_memorize_traps(c, grid);
				square_light_spot(c, grid);
			}
		}
	}


	/*** Involuntary Movement ***/

	/* Delayed Word-of-Recall; suspended in arenas */
	if (player->word_recall && !player->upkeep->arena_level) {
		/* Count down towards recall */
		player->word_recall--;

		/* Activate the recall */
		if (!player->word_recall) {
			/*
			 * Disturbing!  Also, flush the command queue to avoid
			 * losing an action on the new level
			 */
			disturb(player);
			cmdq_flush();

			/* Determine the level */
			if (player->depth) {
				msgt(MSG_TPLEVEL, "You feel yourself yanked upwards!");
				dungeon_change_level(player, 0);
			} else {
				msgt(MSG_TPLEVEL, "You feel yourself yanked downwards!");
				player_set_recall_depth(player);
				dungeon_change_level(player, player->recall_depth);
			}
		}
	}

	/* Delayed Deep Descent */
	if (player->deep_descent) {
		/* Count down towards descent */
		player->deep_descent--;

		/* Activate the descent */
		if (player->deep_descent == 0) {
			/* Calculate target depth */
			int target_increment = (4 / z_info->stair_skip) + 1;
			int target_depth = dungeon_get_next_level(player,
				player->max_depth, target_increment);
			disturb(player);

			/* Determine the level */
			if (target_depth > player->depth) {
				msgt(MSG_TPLEVEL, "The floor opens beneath you!");
				dungeon_change_level(player, target_depth);
			} else {
				/* Otherwise do something disastrous */
				msgt(MSG_TPLEVEL, "You are thrown back in an explosion!");
				effect_simple(EF_DESTRUCTION, source_none(), "0", 0, 5, 0, 0, 0, NULL);
			}
		}
	}
}